

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O2

void __thiscall Js::PathTypeHandlerBase::ShrinkSlotAndInlineSlotCapacity(PathTypeHandlerBase *this)

{
  bool bVar1;
  ushort newInlineSlotCapacity;
  PathTypeHandlerBase *pPVar2;
  uint16 local_1a [4];
  uint16 maxPathLength;
  
  if (((this->super_DynamicTypeHandler).propertyTypes & 0x40) == 0) {
    pPVar2 = GetRootPathTypeHandler(this);
    local_1a[0] = 0;
    bVar1 = GetMaxPathLength(pPVar2,local_1a);
    if (bVar1) {
      bVar1 = DynamicTypeHandler::IsObjectHeaderInlinedTypeHandler(&this->super_DynamicTypeHandler);
      if (bVar1) {
        newInlineSlotCapacity =
             DynamicTypeHandler::RoundUpObjectHeaderInlinedInlineSlotCapacity(local_1a[0]);
      }
      else {
        newInlineSlotCapacity = DynamicTypeHandler::RoundUpInlineSlotCapacity(local_1a[0]);
      }
      if (newInlineSlotCapacity < (this->super_DynamicTypeHandler).inlineSlotCapacity) {
        ShrinkSlotAndInlineSlotCapacity(pPVar2,newInlineSlotCapacity);
        goto LAB_00c4bb2b;
      }
    }
    (*(pPVar2->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x3e])(pPVar2);
  }
LAB_00c4bb2b:
  pPVar2 = GetRootPathTypeHandler(this);
  (*(pPVar2->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x40])(pPVar2);
  return;
}

Assistant:

void PathTypeHandlerBase::ShrinkSlotAndInlineSlotCapacity()
    {
        if (!GetIsInlineSlotCapacityLocked())
        {
            PathTypeHandlerBase * rootTypeHandler = GetRootPathTypeHandler();

            bool shrunk = false;
            uint16 maxPathLength = 0;
            if (rootTypeHandler->GetMaxPathLength(&maxPathLength))
            {
                uint16 newInlineSlotCapacity =
                    IsObjectHeaderInlinedTypeHandler()
                        ? RoundUpObjectHeaderInlinedInlineSlotCapacity(maxPathLength)
                        : RoundUpInlineSlotCapacity(maxPathLength);
                if (newInlineSlotCapacity < GetInlineSlotCapacity())
                {
                    rootTypeHandler->ShrinkSlotAndInlineSlotCapacity(newInlineSlotCapacity);
                    shrunk = true;
                }
            }

            if (!shrunk)
            {
                rootTypeHandler->LockInlineSlotCapacity();
            }
        }

#if DBG
        PathTypeHandlerBase * rootTypeHandler = GetRootPathTypeHandler();
        rootTypeHandler->VerifyInlineSlotCapacityIsLocked();
#endif
    }